

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O1

ktx_error_code_e
ktxTexture2_IterateLoadLevelFaces(ktxTexture2 *This,PFNKTXITERCB iterCb,void *userdata)

{
  ktxStream *pkVar1;
  ktxSupercmpScheme kVar2;
  ktxTexture_protected *pkVar3;
  ktxTexture2_private *pkVar4;
  ktx_uint64_t kVar5;
  byte bVar6;
  uint uVar7;
  ktx_error_code_e kVar8;
  ZSTD_ErrorCode ZVar9;
  uint uVar10;
  uchar *pSrc;
  uchar *puVar11;
  ZSTD_DCtx *dctx;
  ulong uVar12;
  uint uVar13;
  ktx_error_code_e kVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  bool bVar22;
  bool bVar23;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  undefined1 extraout_var_01 [12];
  undefined1 auVar26 [12];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int local_8c;
  uchar *local_88;
  ktx_size_t uncompressedDataSize;
  uchar *local_40;
  size_t local_38;
  
  pkVar3 = This->_protected;
  uncompressedDataSize = 0;
  if (This == (ktxTexture2 *)0x0) {
    return KTX_INVALID_VALUE;
  }
  if (((This->classId != ktxTexture2_c) ||
      (kVar2 = This->supercompressionScheme, KTX_SS_END_RANGE < kVar2)) ||
     (kVar2 == KTX_SS_BASIS_LZ)) {
    return KTX_INVALID_OPERATION;
  }
  if (iterCb == (PFNKTXITERCB)0x0) {
    return KTX_INVALID_VALUE;
  }
  uVar15 = 10;
  if ((pkVar3->_stream).data.file == (FILE *)0x0) {
    return KTX_INVALID_OPERATION;
  }
  pkVar4 = This->_private;
  local_38 = pkVar4->_levelIndex[0].byteLength;
  pSrc = (uchar *)malloc(local_38);
  if (pSrc == (uchar *)0x0) {
    return KTX_OUT_OF_MEMORY;
  }
  kVar8 = KTX_SUCCESS;
  if ((kVar2 & ~KTX_SS_BASIS_LZ) == KTX_SS_ZSTD) {
    uncompressedDataSize = pkVar4->_levelIndex[0].uncompressedByteLength;
    puVar11 = (uchar *)malloc(uncompressedDataSize);
    if (puVar11 == (uchar *)0x0) {
      kVar8 = KTX_OUT_OF_MEMORY;
      dctx = (ZSTD_DCtx *)0x0;
      local_88 = (uchar *)0x0;
      goto LAB_001f1527;
    }
    local_88 = puVar11;
    if (kVar2 == KTX_SS_ZSTD) {
      dctx = ZSTD_createDCtx();
    }
    else {
      dctx = (ZSTD_DCtx *)0x0;
    }
  }
  else {
    dctx = (ZSTD_DCtx *)0x0;
    local_88 = (uchar *)0x0;
    puVar11 = pSrc;
  }
  kVar14 = (ktx_error_code_e)uVar15;
  pkVar1 = &pkVar3->_stream;
  uVar7 = This->numLevels - 1;
  if (-1 < (int)uVar7) {
    uVar19 = (ulong)uVar7;
    local_40 = puVar11;
    do {
      bVar6 = (byte)uVar19;
      uVar7 = This->baseWidth >> (bVar6 & 0x1f);
      iVar21 = uVar7 + (uVar7 == 0);
      uVar7 = This->baseHeight >> (bVar6 & 0x1f);
      iVar20 = uVar7 + (uVar7 == 0);
      uVar7 = This->baseDepth >> (bVar6 & 0x1f);
      iVar17 = uVar7 + (uVar7 == 0);
      uVar12 = pkVar4->_levelIndex[uVar19].byteLength;
      kVar8 = KTX_FILE_DATA_ERROR;
      local_8c = 2;
      uVar16 = uVar15;
      if (uVar12 <= local_38) {
        kVar5 = This->_private->_firstLevelFileOffset;
        if (kVar5 == 0) {
          __assert_fail("This->_private->_firstLevelFileOffset != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                        ,0x69b,
                        "ktx_uint64_t ktxTexture2_levelFileOffset(ktxTexture2 *, ktx_uint32_t)");
        }
        kVar8 = (*(pkVar3->_stream).setpos)
                          (pkVar1,kVar5 + This->_private->_levelIndex[uVar19].byteOffset);
        if ((kVar8 == KTX_SUCCESS) &&
           (kVar8 = (*pkVar1->read)(pkVar1,pSrc,uVar12), kVar8 == KTX_SUCCESS)) {
          if (This->supercompressionScheme == KTX_SS_END_RANGE) {
            kVar8 = ktxUncompressZLIBInt(local_88,&uncompressedDataSize,pSrc,uVar12);
            auVar26 = extraout_var_01;
            if (kVar8 != KTX_SUCCESS) {
              local_8c = 1;
              uVar16 = (ulong)kVar8;
              goto LAB_001f1213;
            }
          }
          else {
            auVar26 = extraout_var;
            if (This->supercompressionScheme == KTX_SS_ZSTD) {
              uVar12 = ZSTD_decompressDCtx(dctx,local_88,uncompressedDataSize,pSrc,uVar12);
              uVar7 = ZSTD_isError(uVar12);
              auVar26 = extraout_var_00;
              if (uVar7 != 0) {
                ZVar9 = ZSTD_getErrorCode(uVar12);
                if (ZVar9 == ZSTD_error_dstSize_tooSmall) {
                  kVar8 = KTX_DECOMPRESS_LENGTH_ERROR;
                }
                else if (ZVar9 == ZSTD_error_memory_allocation) {
                  kVar8 = KTX_OUT_OF_MEMORY;
                }
                else if (ZVar9 == ZSTD_error_checksum_wrong) {
                  kVar8 = KTX_DECOMPRESS_CHECKSUM_ERROR;
                }
                else {
                  kVar8 = KTX_FILE_DATA_ERROR;
                }
                goto LAB_001f120e;
              }
            }
          }
          puVar11 = local_40;
          kVar8 = KTX_DECOMPRESS_LENGTH_ERROR;
          if (pkVar4->_levelIndex[uVar19].uncompressedByteLength == uVar12) {
            iVar18 = (int)uVar19;
            if ((This->isCubemap == true) && (This->isArray == false)) {
              auVar24._0_4_ = (float)iVar21 / (float)(pkVar3->_formatSize).blockWidth;
              auVar24._4_12_ = auVar26;
              auVar24 = roundss(auVar24,auVar24,10);
              auVar25 = ZEXT416((uint)((float)iVar20 / (float)(pkVar3->_formatSize).blockHeight));
              auVar25 = roundss(auVar25,auVar25,10);
              uVar7 = (pkVar3->_formatSize).minBlocksX;
              uVar13 = (uint)(long)auVar24._0_4_;
              if (uVar13 < uVar7) {
                uVar13 = uVar7;
              }
              uVar10 = (uint)(long)auVar25._0_4_;
              if (uVar10 < uVar7) {
                uVar10 = uVar7;
              }
              kVar8 = KTX_SUCCESS;
              bVar23 = This->numFaces == 0;
              bVar22 = !bVar23;
              if (bVar23) {
                local_8c = 0;
              }
              else {
                uVar12 = (ulong)(uVar13 * (pkVar3->_formatSize).blockSizeInBits * uVar10 >> 3);
                kVar8 = (*iterCb)(iVar18,0,iVar21,iVar20,iVar17,uVar12,local_40,userdata);
                local_8c = 2;
                if (kVar8 == KTX_SUCCESS) {
                  uVar7 = 1;
                  do {
                    puVar11 = puVar11 + uVar12;
                    bVar22 = uVar7 < This->numFaces;
                    if (!bVar22) {
                      local_8c = 0;
                      kVar8 = KTX_SUCCESS;
                      break;
                    }
                    kVar8 = (*iterCb)(iVar18,uVar7,iVar21,iVar20,iVar17,uVar12,puVar11,userdata);
                    uVar7 = uVar7 + 1;
                  } while (kVar8 == KTX_SUCCESS);
                }
              }
              uVar16 = uVar15 & 0xffffffff;
              kVar14 = kVar8;
              if (bVar22) goto LAB_001f1213;
            }
            else {
              kVar8 = (*iterCb)(iVar18,0,iVar21,iVar20,iVar17,uVar12 & 0xffffffff,local_40,userdata)
              ;
              kVar14 = KTX_SUCCESS;
              if (kVar8 != KTX_SUCCESS) goto LAB_001f120e;
            }
            kVar8 = kVar14;
            uVar16 = uVar15 & 0xffffffff;
            local_8c = 0;
            goto LAB_001f1213;
          }
        }
LAB_001f120e:
        uVar16 = uVar15 & 0xffffffff;
        local_8c = 2;
      }
LAB_001f1213:
      kVar14 = (ktx_error_code_e)uVar16;
      if (local_8c != 0) goto LAB_001f14fe;
      bVar22 = 0 < (long)uVar19;
      uVar15 = uVar16;
      uVar19 = uVar19 - 1;
    } while (bVar22);
  }
  local_8c = 3;
LAB_001f14fe:
  if (local_8c != 2) {
    if (local_8c != 3) {
      return kVar14;
    }
    (*(pkVar3->_stream).destruct)(pkVar1);
    This->_private->_firstLevelFileOffset = 0;
  }
LAB_001f1527:
  free(pSrc);
  if (local_88 != (uchar *)0x0) {
    free(local_88);
  }
  if (dctx != (ZSTD_DCtx *)0x0) {
    ZSTD_freeDCtx(dctx);
  }
  return kVar8;
}

Assistant:

KTX_error_code
ktxTexture2_IterateLoadLevelFaces(ktxTexture2* This, PFNKTXITERCB iterCb,
                                  void* userdata)
{
    DECLARE_PROTECTED(ktxTexture);
    ktxStream* stream = (ktxStream *)&prtctd->_stream;
    ktxLevelIndexEntry* levelIndex;
    ktx_size_t      dataSize = 0, uncompressedDataSize = 0;
    KTX_error_code  result = KTX_SUCCESS;
    ktx_uint8_t*    dataBuf = NULL;
    ktx_uint8_t*    uncompressedDataBuf = NULL;
    ktx_uint8_t*    pData;
    ZSTD_DCtx*      dctx = NULL;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (This->classId != ktxTexture2_c)
        return KTX_INVALID_OPERATION;

    if (This->supercompressionScheme != KTX_SS_NONE &&
        This->supercompressionScheme != KTX_SS_ZSTD &&
        This->supercompressionScheme != KTX_SS_ZLIB)
        return KTX_INVALID_OPERATION;

    if (iterCb == NULL)
        return KTX_INVALID_VALUE;

    if (prtctd->_stream.data.file == NULL)
        // This Texture not created from a stream or images are already loaded.
        return KTX_INVALID_OPERATION;

    levelIndex = This->_private->_levelIndex;

    // Allocate memory sufficient for the base level
    dataSize = levelIndex[0].byteLength;
    dataBuf = malloc(dataSize);
    if (!dataBuf)
        return KTX_OUT_OF_MEMORY;
    if (This->supercompressionScheme == KTX_SS_ZSTD || This->supercompressionScheme == KTX_SS_ZLIB) {
        uncompressedDataSize = levelIndex[0].uncompressedByteLength;
        uncompressedDataBuf = malloc(uncompressedDataSize);
        if (!uncompressedDataBuf) {
            result = KTX_OUT_OF_MEMORY;
            goto cleanup;
        }
        if (This->supercompressionScheme == KTX_SS_ZSTD) {
            dctx = ZSTD_createDCtx();
        }
        pData = uncompressedDataBuf;
    } else {
        pData = dataBuf;
    }

    for (ktx_int32_t level = This->numLevels - 1; level >= 0; --level)
    {
        ktx_size_t   levelSize;
        GLsizei      width, height, depth;

        // Array textures have the same number of layers at each mip level.
        width = MAX(1, This->baseWidth  >> level);
        height = MAX(1, This->baseHeight >> level);
        depth = MAX(1, This->baseDepth  >> level);

        levelSize = levelIndex[level].byteLength;
        if (dataSize < levelSize) {
            // Levels cannot be larger than the base level
            result = KTX_FILE_DATA_ERROR;
            goto cleanup;
        }

        // Use setpos so we skip any padding.
        result = stream->setpos(stream,
                                ktxTexture2_levelFileOffset(This, level));
        if (result != KTX_SUCCESS)
            goto cleanup;

        result = stream->read(stream, dataBuf, levelSize);
        if (result != KTX_SUCCESS)
            goto cleanup;

        if (This->supercompressionScheme == KTX_SS_ZSTD) {
            levelSize =
                ZSTD_decompressDCtx(dctx, uncompressedDataBuf,
                                  uncompressedDataSize,
                                  dataBuf,
                                  levelSize);
            if (ZSTD_isError(levelSize)) {
                ZSTD_ErrorCode error = ZSTD_getErrorCode(levelSize);
                switch(error) {
                  case ZSTD_error_dstSize_tooSmall:
                    result = KTX_DECOMPRESS_LENGTH_ERROR; // inflatedDataCapacity too small.
                    goto cleanup;
                  case ZSTD_error_checksum_wrong:
                    result =  KTX_DECOMPRESS_CHECKSUM_ERROR;
                    goto cleanup;
                  case ZSTD_error_memory_allocation:
                    result = KTX_OUT_OF_MEMORY;
                    goto cleanup;
                  default:
                    result = KTX_FILE_DATA_ERROR;
                    goto cleanup;
                }
            }

            // We don't fix up the texture's dataSize, levelIndex or
            // _requiredAlignment because after this function completes there
            // is no way to get at the texture's data.
            //nindex[level].byteOffset = levelOffset;
            //nindex[level].uncompressedByteLength = nindex[level].byteLength =
                                                                //levelByteLength;
        } else if (This->supercompressionScheme == KTX_SS_ZLIB) {
            result = ktxUncompressZLIBInt(uncompressedDataBuf,
                                            &uncompressedDataSize,
                                            dataBuf,
                                            levelSize);
            if (result != KTX_SUCCESS)
                return result;
        }

        if (levelIndex[level].uncompressedByteLength != levelSize) {
            result = KTX_DECOMPRESS_LENGTH_ERROR;
            goto cleanup;
        }


#if IS_BIG_ENDIAN
        switch (prtctd->_typeSize) {
          case 2:
            _ktxSwapEndian16((ktx_uint16_t*)pData, levelSize / 2);
            break;
          case 4:
            _ktxSwapEndian32((ktx_uint32_t*)pDest, levelSize / 4);
            break;
          case 8:
            _ktxSwapEndian64((ktx_uint64_t*)pDest, levelSize / 8);
            break;
        }
#endif

        // With the exception of non-array cubemaps the entire level
        // is passed at once because that is how OpenGL and Vulkan need them.
        // Vulkan could take all the faces at once too but we iterate
        // them separately for OpenGL.
        if (This->isCubemap && !This->isArray) {
            ktx_uint8_t* pFace = pData;
            struct blockCount {
                ktx_uint32_t x, y;
            } blockCount;
            ktx_size_t faceSize;

            blockCount.x
              = (uint32_t)ceilf((float)width / prtctd->_formatSize.blockWidth);
            blockCount.y
              = (uint32_t)ceilf((float)height / prtctd->_formatSize.blockHeight);
            blockCount.x = MAX(prtctd->_formatSize.minBlocksX, blockCount.x);
            blockCount.y = MAX(prtctd->_formatSize.minBlocksX, blockCount.y);
            faceSize = blockCount.x * blockCount.y
                       * prtctd->_formatSize.blockSizeInBits / 8;

            for (ktx_uint32_t face = 0; face < This->numFaces; ++face) {
                result = iterCb(level, face,
                                width, height, depth,
                                (ktx_uint32_t)faceSize, pFace, userdata);
                pFace += faceSize;
                if (result != KTX_SUCCESS)
                    goto cleanup;
            }
        } else {
            result = iterCb(level, 0,
                             width, height, depth,
                             (ktx_uint32_t)levelSize, pData, userdata);
            if (result != KTX_SUCCESS)
                goto cleanup;
       }
    }

    // No further need for this.
    stream->destruct(stream);
    This->_private->_firstLevelFileOffset = 0;
cleanup:
    free(dataBuf);
    if (uncompressedDataBuf) free(uncompressedDataBuf);
    if (dctx) ZSTD_freeDCtx(dctx);

    return result;
}